

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O2

Error __thiscall
asmjit::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneAllocator *allocator,uint32_t newSize,uint32_t idealCapacity,
          bool newBitsValue)

{
  BitWord *src;
  BitWord *dst;
  BitWord BVar1;
  sbyte sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t allocatedCapacity;
  
  if (idealCapacity < newSize) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/zonevector.cpp"
               ,0xa6,"idealCapacity >= newSize");
  }
  uVar6 = this->_size;
  if (uVar6 < newSize) {
    src = this->_data;
    dst = src;
    if (this->_capacity < newSize) {
      uVar4 = idealCapacity + 0x3f & 0xffffffc0;
      if (uVar4 < newSize) {
        return 1;
      }
      dst = (BitWord *)ZoneAllocator::alloc(allocator,(ulong)(uVar4 >> 3),&allocatedCapacity);
      if (dst == (BitWord *)0x0) {
        return 1;
      }
      uVar3 = allocatedCapacity * 8;
      if (uVar3 < allocatedCapacity) {
        uVar3 = (ulong)uVar4;
      }
      _copyBits(dst,src,uVar6 + 0x3f >> 6);
      if (src != (BitWord *)0x0) {
        ZoneAllocator::release(allocator,src,(ulong)(this->_capacity >> 3));
      }
      this->_data = dst;
      this->_capacity = (uint32_t)uVar3;
    }
    uVar5 = uVar6 >> 6;
    uVar3 = (ulong)uVar5;
    uVar4 = newSize & 0x3f;
    uVar6 = uVar6 & 0x3f;
    if (uVar6 != 0) {
      if (uVar5 == newSize >> 6) {
        sVar2 = (sbyte)uVar4;
        if (uVar4 <= uVar6) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/zonevector.cpp"
                     ,0xee,"startBit < endBit");
        }
      }
      else {
        sVar2 = 0;
      }
      dst[uVar3] = dst[uVar3] | -(ulong)newBitsValue << (sVar2 - (char)uVar6 & 0x3fU);
      uVar3 = (ulong)(uVar5 + 1);
    }
    uVar6 = newSize + 0x3f >> 6;
    for (; uVar3 < uVar6; uVar3 = uVar3 + 1) {
      dst[uVar3] = -(ulong)newBitsValue;
    }
    if (uVar4 != 0) {
      BVar1 = 0;
      if (newBitsValue) {
        BVar1 = ~(-1L << (sbyte)uVar4);
      }
      dst[uVar6 - 1] = BVar1;
    }
  }
  else if ((newSize & 0x3f) != 0) {
    this->_data[newSize >> 6] = this->_data[newSize >> 6] & ~(-1L << (sbyte)(newSize & 0x3f));
  }
  this->_size = newSize;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneAllocator* allocator, uint32_t newSize, uint32_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newSize);

  if (newSize <= _size) {
    // The size after the resize is lesser than or equal to the current size.
    uint32_t idx = newSize / kBitWordSizeInBits;
    uint32_t bit = newSize % kBitWordSizeInBits;

    // Just set all bits outside of the new size in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newSize` is a multiply of `kBitWordSizeInBits` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_size`.
    if (bit)
      _data[idx] &= (BitWord(1) << bit) - 1u;

    _size = newSize;
    return kErrorOk;
  }

  uint32_t oldSize = _size;
  BitWord* data = _data;

  if (newSize > _capacity) {
    // Realloc needed, calculate the minimum capacity (in bytes) requied.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(idealCapacity, kBitWordSizeInBits);

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    _copyBits(newData, data, _wordsPerBits(oldSize));

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  // Start (of the old size) and end (of the new size) bits
  uint32_t idx = oldSize / kBitWordSizeInBits;
  uint32_t startBit = oldSize % kBitWordSizeInBits;
  uint32_t endBit = newSize % kBitWordSizeInBits;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = Support::bitMaskFromBool<BitWord>(newBitsValue);

  // First initialize the last bit-word of the old size.
  if (startBit) {
    uint32_t nBits = 0;

    if (idx == (newSize / kBitWordSizeInBits)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old size.
      nBits = kBitWordSizeInBits - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old size.
  uint32_t endIdx = _wordsPerBits(newSize);
  while (idx < endIdx) data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx - 1] = pattern & ((BitWord(1) << endBit) - 1);

  _size = newSize;
  return kErrorOk;
}